

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O2

void calc_kurt_all_cols<InputData<float,long>&,WorkerMemory<ImputedData<long,long_double>,long_double,float>&,long_double>
               (InputData<float,_long> *input_data,
               WorkerMemory<ImputedData<long,_long_double>,_long_double,_float> *workspace,
               ModelParams *model_params,double *kurtosis,double *saved_xmin,double *saved_xmax)

{
  Xoshiro256PP *rnd_generator;
  ColumnSampler<long_double> *this;
  size_t *col;
  vector<double,_std::allocator<double>_> *w;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *w_00;
  long *Xc_indptr;
  pointer pdVar1;
  pointer pdVar2;
  size_t *psVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  double dVar7;
  double dVar8;
  
  this = &workspace->col_sampler;
  ColumnSampler<long_double>::prepare_full_pass(this);
  col = &workspace->col_chosen;
  w = &workspace->weights_arr;
  rnd_generator = &workspace->rnd_generator;
  w_00 = &workspace->weights_map;
  do {
    while( true ) {
      bVar4 = ColumnSampler<long_double>::sample_col(this,col);
      if (!bVar4) {
        return;
      }
      if (saved_xmin != (double *)0x0) break;
      sVar6 = *col;
LAB_0029db66:
      lVar5 = sVar6 - input_data->ncols_numeric;
      if (sVar6 < input_data->ncols_numeric) {
        Xc_indptr = input_data->Xc_indptr;
        pdVar1 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar2 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (Xc_indptr == (long *)0x0) {
          if (pdVar1 == pdVar2) {
            psVar3 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((workspace->weights_map).m_ht.m_nb_elements == 0) {
              dVar7 = calc_kurtosis<float,long_double>
                                (psVar3,workspace->st,workspace->end,
                                 input_data->numeric_data + sVar6 * input_data->nrows,
                                 model_params->missing_action);
            }
            else {
              dVar7 = calc_kurtosis_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                                (psVar3,workspace->st,workspace->end,
                                 input_data->numeric_data + sVar6 * input_data->nrows,
                                 model_params->missing_action,w_00);
            }
          }
          else {
            dVar7 = calc_kurtosis_weighted<float,std::vector<double,std::allocator<double>>,long_double>
                              ((workspace->ix_arr).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start,workspace->st,workspace->end
                               ,input_data->numeric_data + sVar6 * input_data->nrows,
                               model_params->missing_action,w);
          }
        }
        else if (pdVar1 == pdVar2) {
          psVar3 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((workspace->weights_map).m_ht.m_nb_elements == 0) {
            dVar7 = calc_kurtosis<float,long,long_double>
                              (psVar3,workspace->st,workspace->end,sVar6,input_data->Xc,
                               input_data->Xc_ind,Xc_indptr,model_params->missing_action);
          }
          else {
            dVar7 = calc_kurtosis_weighted<float,long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                              (psVar3,workspace->st,workspace->end,sVar6,input_data->Xc,
                               input_data->Xc_ind,Xc_indptr,model_params->missing_action,w_00);
          }
        }
        else {
          dVar7 = calc_kurtosis_weighted<float,long,std::vector<double,std::allocator<double>>,long_double>
                            ((workspace->ix_arr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start,workspace->st,workspace->end,
                             sVar6,input_data->Xc,input_data->Xc_ind,Xc_indptr,
                             model_params->missing_action,w);
        }
      }
      else if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start ==
               (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish) {
        psVar3 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((workspace->weights_map).m_ht.m_nb_elements == 0) {
          dVar7 = calc_kurtosis<long_double>
                            (psVar3,workspace->st,workspace->end,
                             input_data->categ_data + input_data->nrows * lVar5,
                             input_data->ncat[lVar5],
                             (workspace->buffer_szt).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (workspace->buffer_dbl).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start,model_params->missing_action,
                             model_params->cat_split_type,rnd_generator);
        }
        else {
          dVar7 = calc_kurtosis_weighted<tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                            (psVar3,workspace->st,workspace->end,
                             input_data->categ_data + input_data->nrows * lVar5,
                             input_data->ncat[lVar5],
                             (workspace->buffer_dbl).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start,model_params->missing_action,
                             model_params->cat_split_type,rnd_generator,w_00);
        }
      }
      else {
        dVar7 = calc_kurtosis_weighted<std::vector<double,std::allocator<double>>,long_double>
                          ((workspace->ix_arr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,workspace->st,workspace->end,
                           input_data->categ_data + input_data->nrows * lVar5,
                           input_data->ncat[lVar5],
                           (workspace->buffer_dbl).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,model_params->missing_action,
                           model_params->cat_split_type,rnd_generator,w);
      }
      sVar6 = *col;
      kurtosis[sVar6] = dVar7;
      if (dVar7 <= -INFINITY) {
        ColumnSampler<long_double>::drop_col(this,sVar6);
        sVar6 = *col;
        dVar7 = kurtosis[sVar6];
      }
      dVar8 = 0.0;
      if ((-INFINITY < dVar7) && (dVar8 = dVar7 + -1.0, dVar8 <= 1e-08)) {
        dVar8 = 1e-08;
      }
      kurtosis[sVar6] = dVar8;
      if (0.0 < dVar8 && input_data->col_weights != (float *)0x0) {
        dVar8 = dVar8 * (double)input_data->col_weights[sVar6];
        if (dVar8 <= 1e-100) {
          dVar8 = 1e-100;
        }
        kurtosis[sVar6] = dVar8;
      }
    }
    get_split_range<InputData<float,long>,WorkerMemory<ImputedData<long,long_double>,long_double,float>>
              (workspace,input_data,model_params);
    if (workspace->unsplittable != true) {
      sVar6 = workspace->col_chosen;
      saved_xmin[sVar6] = workspace->xmin;
      saved_xmax[sVar6] = workspace->xmax;
      goto LAB_0029db66;
    }
    ColumnSampler<long_double>::drop_col(this,*col);
  } while( true );
}

Assistant:

void calc_kurt_all_cols(InputData &input_data, WorkerMemory &workspace, ModelParams &model_params,
                        double *restrict kurtosis, double *restrict saved_xmin, double *restrict saved_xmax)
{
    workspace.col_sampler.prepare_full_pass();
    while (workspace.col_sampler.sample_col(workspace.col_chosen))
    {
        if (saved_xmin != NULL)
        {
            get_split_range(workspace, input_data, model_params);
            if (workspace.unsplittable)
            {
                workspace.col_sampler.drop_col(workspace.col_chosen);
                continue;
            }

            if (saved_xmin != NULL)
            {
                saved_xmin[workspace.col_chosen] = workspace.xmin;
                saved_xmax[workspace.col_chosen] = workspace.xmax;
            }
        }

        if (workspace.col_chosen < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr == NULL)
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                      ldouble_safe>(
                                      workspace.ix_arr.data(), workspace.st, workspace.end,
                                      input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                      model_params.missing_action);
                }

                else if (!workspace.weights_arr.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                               decltype(workspace.weights_arr), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                               model_params.missing_action, workspace.weights_arr);
                }

                else
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                               decltype(workspace.weights_map), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                               model_params.missing_action, workspace.weights_map);
                }
            }

            else
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                      typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                      ldouble_safe>(
                                      workspace.ix_arr.data(), workspace.st, workspace.end,
                                      workspace.col_chosen,
                                      input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                      model_params.missing_action);
                }

                else if (!workspace.weights_arr.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                               typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                               decltype(workspace.weights_arr), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               workspace.col_chosen,
                                               input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                               model_params.missing_action, workspace.weights_arr);
                }

                else
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                               typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                               decltype(workspace.weights_map), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               workspace.col_chosen,
                                               input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                               model_params.missing_action, workspace.weights_map);
                }
            }
        }

        else
        {
            size_t col = workspace.col_chosen - input_data.ncols_numeric;
            if (workspace.weights_arr.empty() && workspace.weights_map.empty())
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis<ldouble_safe>(
                                  workspace.ix_arr.data(), workspace.st, workspace.end,
                                  input_data.categ_data + col * input_data.nrows,
                                  input_data.ncat[col],
                                  workspace.buffer_szt.data(), workspace.buffer_dbl.data(),
                                  model_params.missing_action, model_params.cat_split_type,
                                  workspace.rnd_generator);
            }

            else if (!workspace.weights_arr.empty())
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis_weighted<decltype(workspace.weights_arr), ldouble_safe>(
                                           workspace.ix_arr.data(), workspace.st, workspace.end,
                                           input_data.categ_data + col * input_data.nrows,
                                           input_data.ncat[col],
                                           workspace.buffer_dbl.data(),
                                           model_params.missing_action, model_params.cat_split_type,
                                           workspace.rnd_generator, workspace.weights_arr);
            }

            else
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis_weighted<decltype(workspace.weights_map), ldouble_safe>(
                                           workspace.ix_arr.data(), workspace.st, workspace.end,
                                           input_data.categ_data + col * input_data.nrows,
                                           input_data.ncat[col],
                                           workspace.buffer_dbl.data(),
                                           model_params.missing_action, model_params.cat_split_type,
                                           workspace.rnd_generator, workspace.weights_map);
            }
        }

        if (kurtosis[workspace.col_chosen] == -HUGE_VAL)
            workspace.col_sampler.drop_col(workspace.col_chosen);

        kurtosis[workspace.col_chosen] = (kurtosis[workspace.col_chosen] == -HUGE_VAL)?
                                            0. : std::fmax(1e-8, -1. + kurtosis[workspace.col_chosen]);
        if (input_data.col_weights != NULL && kurtosis[workspace.col_chosen] > 0)
        {
            kurtosis[workspace.col_chosen] *= input_data.col_weights[workspace.col_chosen];
            kurtosis[workspace.col_chosen] = std::fmax(kurtosis[workspace.col_chosen], 1e-100);
        }
    }
}